

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall
Lowerer::LowerProfiledStElemI(Lowerer *this,JitProfilingInstr *instr,PropertyOperationFlags flags)

{
  LowererMD *pLVar1;
  Func *func;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  IntConstOpnd *pIVar6;
  AddrOpnd *pAVar7;
  Opnd *pOVar8;
  IndirOpnd *this_00;
  RegOpnd *opndArg;
  HelperCallOpnd *newSrc;
  JnHelperMethod fnHelper;
  
  if (instr == (JitProfilingInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x235a,"(instr)","instr");
    if (!bVar3) goto LAB_0056e9a8;
    *puVar5 = 0;
  }
  func = (instr->super_Instr).m_func;
  if (flags == PropertyOperation_None) {
    fnHelper = HelperProfiledStElem_DefaultFlags;
  }
  else {
    pLVar1 = &this->m_lowererMD;
    pIVar6 = IR::IntConstOpnd::New(0,TyInt8,func,false);
    LowererMD::LoadHelperArgument(pLVar1,&instr->super_Instr,&pIVar6->super_Opnd);
    pIVar6 = IR::IntConstOpnd::New(0,TyInt8,func,false);
    LowererMD::LoadHelperArgument(pLVar1,&instr->super_Instr,&pIVar6->super_Opnd);
    pIVar6 = IR::IntConstOpnd::New((long)(int)flags,TyInt32,func,true);
    LowererMD::LoadHelperArgument(pLVar1,&instr->super_Instr,&pIVar6->super_Opnd);
    fnHelper = HelperProfiledStElem;
  }
  pLVar1 = &this->m_lowererMD;
  pIVar6 = IR::Opnd::CreateProfileIdOpnd(instr->profileId,func);
  LowererMD::LoadHelperArgument(pLVar1,&instr->super_Instr,&pIVar6->super_Opnd);
  pAVar7 = CreateFunctionBodyOpnd(this,func);
  LowererMD::LoadHelperArgument(pLVar1,&instr->super_Instr,&pAVar7->super_Opnd);
  pOVar8 = IR::Instr::UnlinkSrc1(&instr->super_Instr);
  LowererMD::LoadHelperArgument(pLVar1,&instr->super_Instr,pOVar8);
  pOVar8 = IR::Instr::UnlinkDst(&instr->super_Instr);
  this_00 = IR::Opnd::AsIndirOpnd(pOVar8);
  pAVar7 = (AddrOpnd *)IR::IndirOpnd::UnlinkIndexOpnd(this_00);
  if (pAVar7 == (AddrOpnd *)0x0) {
    uVar4 = this_00->m_offset;
    if ((int)uVar4 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x237b,
                         "(indexOpnd || indir->GetOffset() >= 0 && !Js::TaggedInt::IsOverflow(indir->GetOffset()))"
                         ,
                         "indexOpnd || indir->GetOffset() >= 0 && !Js::TaggedInt::IsOverflow(indir->GetOffset())"
                        );
      if (!bVar3) {
LAB_0056e9a8:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
      uVar4 = this_00->m_offset;
    }
    pAVar7 = IR::AddrOpnd::New((Var)((ulong)uVar4 | 0x1000000000000),AddrOpndKindDynamicVar,func,
                               false,(Var)0x0);
  }
  LowererMD::LoadHelperArgument(pLVar1,&instr->super_Instr,&pAVar7->super_Opnd);
  opndArg = IR::IndirOpnd::UnlinkBaseOpnd(this_00);
  LowererMD::LoadHelperArgument(pLVar1,&instr->super_Instr,&opndArg->super_Opnd);
  IR::Opnd::Free(&this_00->super_Opnd,func);
  newSrc = IR::HelperCallOpnd::New(fnHelper,func);
  IR::Instr::SetSrc1(&instr->super_Instr,&newSrc->super_Opnd);
  LowererMD::LowerCall(pLVar1,&instr->super_Instr,0);
  return;
}

Assistant:

void Lowerer::LowerProfiledStElemI(IR::JitProfilingInstr *const instr, const Js::PropertyOperationFlags flags)
{
    Assert(instr);

    /*
        void ProfilingHelpers::ProfiledStElem(
            const Var base,
            const Var varIndex,
            const Var value,
            FunctionBody *const functionBody,
            const ProfileId profileId,
            const PropertyOperationFlags flags,
            bool didArrayAccessHelperCall,
            bool bailedOutOnArraySpecialization)
    */

    Func *const func = instr->m_func;

    IR::JnHelperMethod helper;
    if(flags == Js::PropertyOperation_None)
    {
        helper = IR::HelperProfiledStElem_DefaultFlags;
    }
    else
    {
        helper = IR::HelperProfiledStElem;
        m_lowererMD.LoadHelperArgument(instr, IR::IntConstOpnd::New(false, TyInt8, func));
        m_lowererMD.LoadHelperArgument(instr, IR::IntConstOpnd::New(false, TyInt8, func));
        m_lowererMD.LoadHelperArgument(instr, IR::IntConstOpnd::New(flags, TyInt32, func, true));
    }
    m_lowererMD.LoadHelperArgument(instr, IR::Opnd::CreateProfileIdOpnd(instr->profileId, func));
    m_lowererMD.LoadHelperArgument(instr, CreateFunctionBodyOpnd(func));
    m_lowererMD.LoadHelperArgument(instr, instr->UnlinkSrc1());
    IR::IndirOpnd *const indir = instr->UnlinkDst()->AsIndirOpnd();
    IR::Opnd *const indexOpnd = indir->UnlinkIndexOpnd();
    Assert(indexOpnd || indir->GetOffset() >= 0 && !Js::TaggedInt::IsOverflow(indir->GetOffset()));
    m_lowererMD.LoadHelperArgument(
        instr,
        indexOpnd
            ? static_cast<IR::Opnd *>(indexOpnd)
            : IR::AddrOpnd::New(Js::TaggedInt::ToVarUnchecked(indir->GetOffset()), IR::AddrOpndKindDynamicVar, func));
    m_lowererMD.LoadHelperArgument(instr, indir->UnlinkBaseOpnd());
    indir->Free(func);

    instr->SetSrc1(IR::HelperCallOpnd::New(helper, func));
    m_lowererMD.LowerCall(instr, 0);
}